

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderDNA.h
# Opt level: O0

void __thiscall
Assimp::Blender::Structure::_defaultInitializer<0>::operator()
          (_defaultInitializer<0> *this,CustomData *out,char *param_2)

{
  CustomData local_100;
  char *local_20;
  char *param_2_local;
  CustomData *out_local;
  _defaultInitializer<0> *this_local;
  
  local_20 = param_2;
  param_2_local = (char *)out;
  out_local = (CustomData *)this;
  memset(&local_100,0,0xe0);
  CustomData::CustomData(&local_100);
  CustomData::operator=((CustomData *)param_2_local,&local_100);
  CustomData::~CustomData(&local_100);
  return;
}

Assistant:

void operator ()(T& out, const char* = NULL) {
            out = T();
        }